

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O1

void __thiscall
Hpipe::Instruction::get_unused_rec
          (Instruction *this,Vec<Hpipe::Instruction_*> *to_remove,Instruction **init)

{
  pointer *pppIVar1;
  iterator __position;
  pointer pTVar2;
  int iVar3;
  Transition *t;
  pointer pTVar4;
  Instruction *local_28;
  
  local_28 = (Instruction *)(ulong)cur_op_id;
  if (this->op_id == cur_op_id) {
    return;
  }
  this->op_id = cur_op_id;
  iVar3 = (*this->_vptr_Instruction[0xb])();
  if ((char)iVar3 != '\0') {
    if (*init == this) {
      pTVar4 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
               super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)(this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar4 != 0x28) goto LAB_00151cae;
      *init = pTVar4->inst;
    }
    __position._M_current =
         (to_remove->super_vector<Hpipe::Instruction_*,_std::allocator<Hpipe::Instruction_*>_>).
         super__Vector_base<Hpipe::Instruction_*,_std::allocator<Hpipe::Instruction_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_28 = this;
    if (__position._M_current ==
        (to_remove->super_vector<Hpipe::Instruction_*,_std::allocator<Hpipe::Instruction_*>_>).
        super__Vector_base<Hpipe::Instruction_*,_std::allocator<Hpipe::Instruction_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Hpipe::Instruction*,std::allocator<Hpipe::Instruction*>>::
      _M_realloc_insert<Hpipe::Instruction*const&>
                ((vector<Hpipe::Instruction*,std::allocator<Hpipe::Instruction*>> *)to_remove,
                 __position,&local_28);
    }
    else {
      *__position._M_current = this;
      pppIVar1 = &(to_remove->
                  super_vector<Hpipe::Instruction_*,_std::allocator<Hpipe::Instruction_*>_>).
                  super__Vector_base<Hpipe::Instruction_*,_std::allocator<Hpipe::Instruction_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppIVar1 = *pppIVar1 + 1;
    }
  }
LAB_00151cae:
  pTVar2 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
           super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar4 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
                super__Vector_impl_data._M_start; pTVar4 != pTVar2; pTVar4 = pTVar4 + 1) {
    (*pTVar4->inst->_vptr_Instruction[8])(pTVar4->inst,to_remove,init);
  }
  return;
}

Assistant:

void Instruction::get_unused_rec( Vec<Instruction *> &to_remove, Instruction *&init ) {
    if ( op_id == Instruction::cur_op_id )
        return;
    op_id = Instruction::cur_op_id;

    if ( can_be_deleted() ) {
        if ( this == init ) {
            if ( next.size() == 1 ) {
                init = next[ 0 ].inst;
                to_remove << this;
            }
        } else
            to_remove << this;
    }

    for( Transition &t : next )
        t.inst->get_unused_rec( to_remove, init );
}